

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O0

void __thiscall
GuidedMeshNormalFiltering::updateFilteredNormalsLocalScheme
          (GuidedMeshNormalFiltering *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *filtered_normals)

{
  allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_> *paVar1;
  allocator<double> *this_00;
  allocator<OpenMesh::VectorT<double,_3>_> *paVar2;
  ParameterSet *pPVar3;
  int iVar4;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *mesh_00;
  bool bVar5;
  int iVar6;
  BaseHandle *pBVar7;
  reference __x;
  size_type sVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  vector_type *pvVar12;
  double sigma;
  FaceIter FVar13;
  double local_340;
  vector_type local_338;
  double local_320;
  double range_weight;
  double local_300;
  double range_dis;
  double spatial_weight;
  double local_2d8;
  double spatial_dis;
  int current_face_index;
  int j;
  Normal filtered_normal;
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_neighbor;
  undefined1 auStack_290 [4];
  int index;
  value_handle local_288;
  uint uStack_284;
  undefined1 local_280 [8];
  FaceIter f_it;
  double sigma_s;
  int iter;
  vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
  range_and_mean_normal;
  undefined1 local_228 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  guided_normals;
  undefined1 local_208 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  previous_normals;
  undefined1 local_1e8 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> face_centroid
  ;
  undefined1 local_1c8 [8];
  vector<double,_std::allocator<double>_> face_area;
  undefined1 local_1a8 [8];
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_guided_neighbor;
  undefined1 local_188 [8];
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_face_neighbor;
  double radius;
  FaceNeighborType face_neighbor_type;
  int local_140;
  allocator local_139;
  int vertex_iteration_number;
  double local_118;
  double sigma_r;
  string local_108 [32];
  int local_e8;
  allocator local_e1;
  int normal_iteration_number;
  double local_c0;
  double multiple_sigma_s;
  string local_b0 [32];
  double local_90;
  double multiple_radius;
  string local_80 [35];
  bool local_5d [8];
  bool include_central_face;
  allocator local_49;
  string local_48 [36];
  int local_24;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *pvStack_20;
  int face_neighbor_index;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  *filtered_normals_local;
  TriMesh *mesh_local;
  GuidedMeshNormalFiltering *this_local;
  
  pvStack_20 = filtered_normals;
  filtered_normals_local =
       (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *)mesh;
  mesh_local = (TriMesh *)this;
  iVar6 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x28))();
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (filtered_normals,(long)iVar6);
  pPVar3 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Face Neighbor",&local_49);
  bVar5 = ParameterSet::getValue(pPVar3,(string *)local_48,&local_24);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (((bVar5 ^ 0xffU) & 1) == 0) {
    pPVar3 = (this->super_MeshDenoisingBase).parameter_set_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_80,"include central face",(allocator *)((long)&multiple_radius + 7));
    bVar5 = ParameterSet::getValue(pPVar3,(string *)local_80,local_5d);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)((long)&multiple_radius + 7));
    if (((bVar5 ^ 0xffU) & 1) == 0) {
      pPVar3 = (this->super_MeshDenoisingBase).parameter_set_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_b0,"Multiple(* avg face dis.)",(allocator *)((long)&multiple_sigma_s + 7));
      bVar5 = ParameterSet::getValue(pPVar3,(string *)local_b0,&local_90);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&multiple_sigma_s + 7));
      if (((bVar5 ^ 0xffU) & 1) == 0) {
        pPVar3 = (this->super_MeshDenoisingBase).parameter_set_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&normal_iteration_number,"Multiple(* sigma_s)",&local_e1);
        bVar5 = ParameterSet::getValue(pPVar3,(string *)&normal_iteration_number,&local_c0);
        std::__cxx11::string::~string((string *)&normal_iteration_number);
        std::allocator<char>::~allocator((allocator<char> *)&local_e1);
        if (((bVar5 ^ 0xffU) & 1) == 0) {
          pPVar3 = (this->super_MeshDenoisingBase).parameter_set_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_108,"(Local)Normal Iteration Num.",(allocator *)((long)&sigma_r + 7));
          bVar5 = ParameterSet::getValue(pPVar3,(string *)local_108,&local_e8);
          std::__cxx11::string::~string(local_108);
          std::allocator<char>::~allocator((allocator<char> *)((long)&sigma_r + 7));
          if (((bVar5 ^ 0xffU) & 1) == 0) {
            pPVar3 = (this->super_MeshDenoisingBase).parameter_set_;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&vertex_iteration_number,"sigma_r",&local_139);
            bVar5 = ParameterSet::getValue(pPVar3,(string *)&vertex_iteration_number,&local_118);
            std::__cxx11::string::~string((string *)&vertex_iteration_number);
            std::allocator<char>::~allocator((allocator<char> *)&local_139);
            if (((bVar5 ^ 0xffU) & 1) == 0) {
              pPVar3 = (this->super_MeshDenoisingBase).parameter_set_;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&face_neighbor_type,"Vertex Iteration Num.",
                         (allocator *)((long)&radius + 7));
              bVar5 = ParameterSet::getValue(pPVar3,(string *)&face_neighbor_type,&local_140);
              std::__cxx11::string::~string((string *)&face_neighbor_type);
              std::allocator<char>::~allocator((allocator<char> *)((long)&radius + 7));
              if (((bVar5 ^ 0xffU) & 1) == 0) {
                radius._0_4_ = kVertexBased;
                if (local_24 == 0) {
                  radius._0_4_ = kRadiusBased;
                }
                if (radius._0_4_ == kRadiusBased) {
                  all_face_neighbor.
                  super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)getRadius(this,local_90,(TriMesh *)filtered_normals_local);
                }
                iVar6 = (*(code *)(filtered_normals_local->
                                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[1].
                                  super_VectorDataT<double,_3>.values_[2])();
                paVar1 = (allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
                          *)((long)&all_guided_neighbor.
                                    super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
                std::
                allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
                ::allocator(paVar1);
                std::
                vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                ::vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                          *)local_188,(long)iVar6,paVar1);
                std::
                allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
                ::~allocator((allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
                              *)((long)&all_guided_neighbor.
                                        super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                getAllFaceNeighborGMNF
                          (this,(TriMesh *)filtered_normals_local,radius._0_4_,
                           (double)all_face_neighbor.
                                   super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (bool)(local_5d[0] & 1),
                           (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                            *)local_188);
                iVar6 = (*(code *)(filtered_normals_local->
                                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[1].
                                  super_VectorDataT<double,_3>.values_[2])();
                paVar1 = (allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
                          *)((long)&face_area.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
                std::
                allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
                ::allocator(paVar1);
                std::
                vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                ::vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                          *)local_1a8,(long)iVar6,paVar1);
                std::
                allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
                ::~allocator((allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
                              *)((long)&face_area.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage + 7));
                getAllGuidedNeighborGMNF
                          (this,(TriMesh *)filtered_normals_local,
                           (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                            *)local_1a8);
                MeshDenoisingBase::getFaceNormal
                          (&this->super_MeshDenoisingBase,(TriMesh *)filtered_normals_local,
                           pvStack_20);
                iVar6 = (*(code *)(filtered_normals_local->
                                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[1].
                                  super_VectorDataT<double,_3>.values_[2])();
                this_00 = (allocator<double> *)
                          ((long)&face_centroid.
                                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
                std::allocator<double>::allocator(this_00);
                std::vector<double,_std::allocator<double>_>::vector
                          ((vector<double,_std::allocator<double>_> *)local_1c8,(long)iVar6,this_00)
                ;
                std::allocator<double>::~allocator
                          ((allocator<double> *)
                           ((long)&face_centroid.
                                   super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                iVar6 = (*(code *)(filtered_normals_local->
                                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[1].
                                  super_VectorDataT<double,_3>.values_[2])();
                paVar2 = (allocator<OpenMesh::VectorT<double,_3>_> *)
                         ((long)&previous_normals.
                                 super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
                std::allocator<OpenMesh::VectorT<double,_3>_>::allocator(paVar2);
                std::
                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          *)local_1e8,(long)iVar6,paVar2);
                std::allocator<OpenMesh::VectorT<double,_3>_>::~allocator
                          ((allocator<OpenMesh::VectorT<double,_3>_> *)
                           ((long)&previous_normals.
                                   super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                iVar6 = (*(code *)(filtered_normals_local->
                                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[1].
                                  super_VectorDataT<double,_3>.values_[2])();
                paVar2 = (allocator<OpenMesh::VectorT<double,_3>_> *)
                         ((long)&guided_normals.
                                 super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
                std::allocator<OpenMesh::VectorT<double,_3>_>::allocator(paVar2);
                std::
                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          *)local_208,(long)iVar6,paVar2);
                std::allocator<OpenMesh::VectorT<double,_3>_>::~allocator
                          ((allocator<OpenMesh::VectorT<double,_3>_> *)
                           ((long)&guided_normals.
                                   super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                iVar6 = (*(code *)(filtered_normals_local->
                                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[1].
                                  super_VectorDataT<double,_3>.values_[2])();
                paVar2 = (allocator<OpenMesh::VectorT<double,_3>_> *)
                         ((long)&range_and_mean_normal.
                                 super__Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
                std::allocator<OpenMesh::VectorT<double,_3>_>::allocator(paVar2);
                std::
                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          *)local_228,(long)iVar6,paVar2);
                std::allocator<OpenMesh::VectorT<double,_3>_>::~allocator
                          ((allocator<OpenMesh::VectorT<double,_3>_> *)
                           ((long)&range_and_mean_normal.
                                   super__Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                iVar6 = (*(code *)(filtered_normals_local->
                                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[1].
                                  super_VectorDataT<double,_3>.values_[2])();
                std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>::allocator
                          ((allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_> *)
                           ((long)&sigma_s + 7));
                std::
                vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                ::vector((vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                          *)&iter,(long)iVar6,
                         (allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_> *)
                         ((long)&sigma_s + 7));
                std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>::~allocator
                          ((allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_> *)
                           ((long)&sigma_s + 7));
                for (sigma_s._0_4_ = 0; sigma_s._0_4_ < local_e8; sigma_s._0_4_ = sigma_s._0_4_ + 1)
                {
                  MeshDenoisingBase::getFaceCentroid
                            (&this->super_MeshDenoisingBase,(TriMesh *)filtered_normals_local,
                             (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                              *)local_1e8);
                  sigma = getSigmaS(this,local_c0,
                                    (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                     *)local_1e8,(TriMesh *)filtered_normals_local);
                  MeshDenoisingBase::getFaceArea
                            (&this->super_MeshDenoisingBase,(TriMesh *)filtered_normals_local,
                             (vector<double,_std::allocator<double>_> *)local_1c8);
                  MeshDenoisingBase::getFaceNormal
                            (&this->super_MeshDenoisingBase,(TriMesh *)filtered_normals_local,
                             (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                              *)local_208);
                  mesh_00 = filtered_normals_local;
                  std::
                  vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                  ::vector((vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                            *)&f_it.hnd_,
                           (vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                            *)&iter);
                  getGuidedNormals(this,(TriMesh *)mesh_00,
                                   (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                    *)local_1a8,(vector<double,_std::allocator<double>_> *)local_1c8
                                   ,(vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                     *)local_208,
                                   (vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                    *)&f_it.hnd_,
                                   (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    *)local_228);
                  std::
                  vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                  ::~vector((vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                             *)&f_it.hnd_);
                  FVar13 = OpenMesh::PolyConnectivity::faces_begin
                                     ((PolyConnectivity *)filtered_normals_local);
                  while( true ) {
                    f_it.mesh_ = FVar13._8_8_;
                    local_280 = (undefined1  [8])FVar13.mesh_;
                    FVar13 = OpenMesh::PolyConnectivity::faces_end
                                       ((PolyConnectivity *)filtered_normals_local);
                    _auStack_290 = FVar13;
                    bVar5 = OpenMesh::Iterators::
                            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                            ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                                          *)local_280,
                                         (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                                          *)auStack_290);
                    if (!bVar5) break;
                    pBVar7 = &OpenMesh::Iterators::
                              GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                              ::operator->((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                                            *)local_280)->super_BaseHandle;
                    iVar6 = OpenMesh::BaseHandle::idx(pBVar7);
                    __x = std::
                          vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                          ::operator[]((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                        *)local_188,(long)iVar6);
                    std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::vector
                              ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                *)(filtered_normal.super_VectorDataT<double,_3>.values_ + 2),__x);
                    OpenMesh::VectorT<double,_3>::VectorT
                              ((VectorT<double,_3> *)&current_face_index,0.0,0.0,0.0);
                    spatial_dis._4_4_ = 0;
                    while( true ) {
                      iVar4 = spatial_dis._4_4_;
                      sVar8 = std::
                              vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
                              size((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                    *)(filtered_normal.super_VectorDataT<double,_3>.values_ + 2));
                      if ((int)sVar8 <= iVar4) break;
                      pBVar7 = &std::
                                vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                ::operator[]((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                              *)(filtered_normal.super_VectorDataT<double,_3>.
                                                 values_ + 2),(long)spatial_dis._4_4_)->
                                super_BaseHandle;
                      spatial_dis._0_4_ = OpenMesh::BaseHandle::idx(pBVar7);
                      pvVar9 = std::
                               vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                               ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                             *)local_1e8,(long)iVar6);
                      pvVar10 = std::
                                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                              *)local_1e8,(long)spatial_dis._0_4_);
                      OpenMesh::VectorT<double,_3>::operator-
                                ((vector_type *)&spatial_weight,pvVar9,pvVar10);
                      local_2d8 = OpenMesh::VectorT<double,_3>::length
                                            ((VectorT<double,_3> *)&spatial_weight);
                      range_dis = GaussianWeight(this,local_2d8,sigma);
                      pvVar9 = std::
                               vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                               ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                             *)local_228,(long)iVar6);
                      pvVar10 = std::
                                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                              *)local_228,(long)spatial_dis._0_4_);
                      OpenMesh::VectorT<double,_3>::operator-
                                ((vector_type *)&range_weight,pvVar9,pvVar10);
                      local_300 = OpenMesh::VectorT<double,_3>::length
                                            ((VectorT<double,_3> *)&range_weight);
                      local_320 = GaussianWeight(this,local_300,local_118);
                      pvVar9 = std::
                               vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                               ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                             *)local_208,(long)spatial_dis._0_4_);
                      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                          ((vector<double,_std::allocator<double>_> *)local_1c8,
                                           (long)spatial_dis._0_4_);
                      local_340 = *pvVar11 * range_dis * local_320;
                      OpenMesh::VectorT<double,_3>::operator*(&local_338,pvVar9,&local_340);
                      OpenMesh::VectorT<double,_3>::operator+=
                                ((VectorT<double,_3> *)&current_face_index,&local_338);
                      spatial_dis._4_4_ = spatial_dis._4_4_ + 1;
                    }
                    sVar8 = std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                            ::size((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                    *)(filtered_normal.super_VectorDataT<double,_3>.values_ + 2));
                    if (sVar8 != 0) {
                      pvVar12 = OpenMesh::VectorT<double,_3>::normalize
                                          ((VectorT<double,_3> *)&current_face_index);
                      pvVar9 = std::
                               vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                               ::operator[](pvStack_20,(long)iVar6);
                      (pvVar9->super_VectorDataT<double,_3>).values_[0] =
                           (pvVar12->super_VectorDataT<double,_3>).values_[0];
                      (pvVar9->super_VectorDataT<double,_3>).values_[1] =
                           (pvVar12->super_VectorDataT<double,_3>).values_[1];
                      (pvVar9->super_VectorDataT<double,_3>).values_[2] =
                           (pvVar12->super_VectorDataT<double,_3>).values_[2];
                    }
                    std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
                    ~vector((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                            (filtered_normal.super_VectorDataT<double,_3>.values_ + 2));
                    OpenMesh::Iterators::
                    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                                  *)local_280,0);
                    FVar13._8_8_ = f_it.mesh_;
                    FVar13.mesh_ = (mesh_ptr)local_280;
                  }
                  MeshDenoisingBase::updateVertexPosition
                            (&this->super_MeshDenoisingBase,(TriMesh *)filtered_normals_local,
                             pvStack_20,local_140,false);
                }
                std::
                vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                ::~vector((vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                           *)&iter);
                std::
                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::~vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                           *)local_228);
                std::
                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::~vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                           *)local_208);
                std::
                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::~vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                           *)local_1e8);
                std::vector<double,_std::allocator<double>_>::~vector
                          ((vector<double,_std::allocator<double>_> *)local_1c8);
                std::
                vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                           *)local_1a8);
                std::
                vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                           *)local_188);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void GuidedMeshNormalFiltering::updateFilteredNormalsLocalScheme(TriMesh &mesh, std::vector<TriMesh::Normal> &filtered_normals)
{
    filtered_normals.resize((int)mesh.n_faces());
    // get parameter for local scheme normal update
    int face_neighbor_index;
    if(!parameter_set_->getValue(string("Face Neighbor"), face_neighbor_index))
        return;
    bool include_central_face;
    if(!parameter_set_->getValue(string("include central face"), include_central_face))
        return;
    double multiple_radius;
    if(!parameter_set_->getValue(string("Multiple(* avg face dis.)"), multiple_radius))
        return;
    double multiple_sigma_s;
    if(!parameter_set_->getValue(string("Multiple(* sigma_s)"), multiple_sigma_s))
        return;
    int normal_iteration_number;
    if(!parameter_set_->getValue(string("(Local)Normal Iteration Num."), normal_iteration_number))
        return;
    double sigma_r;
    if(!parameter_set_->getValue(string("sigma_r"), sigma_r))
        return;
    int vertex_iteration_number;
    if(!parameter_set_->getValue(string("Vertex Iteration Num."), vertex_iteration_number))
        return;

    FaceNeighborType face_neighbor_type = face_neighbor_index == 0 ? kRadiusBased : kVertexBased;

    double radius;
    if(face_neighbor_type == kRadiusBased)
        radius = getRadius(multiple_radius, mesh);

    std::vector<std::vector<TriMesh::FaceHandle> > all_face_neighbor((int)mesh.n_faces());
    getAllFaceNeighborGMNF(mesh, face_neighbor_type, radius, include_central_face, all_face_neighbor);
    std::vector<std::vector<TriMesh::FaceHandle> > all_guided_neighbor((int)mesh.n_faces());
    getAllGuidedNeighborGMNF(mesh, all_guided_neighbor);
    getFaceNormal(mesh, filtered_normals);

    std::vector<double> face_area((int)mesh.n_faces());
    std::vector<TriMesh::Point> face_centroid((int)mesh.n_faces());
    std::vector<TriMesh::Normal> previous_normals((int)mesh.n_faces());
    std::vector<TriMesh::Normal> guided_normals((int)mesh.n_faces());
    std::vector<std::pair<double, TriMesh::Normal> > range_and_mean_normal((int)mesh.n_faces());
    for(int iter = 0; iter < normal_iteration_number; iter++)
    {
        getFaceCentroid(mesh, face_centroid);
        double sigma_s = getSigmaS(multiple_sigma_s, face_centroid, mesh);
        getFaceArea(mesh, face_area);
        getFaceNormal(mesh, previous_normals);

        getGuidedNormals(mesh, all_guided_neighbor, face_area, previous_normals, range_and_mean_normal, guided_normals);

        // Filtered Face Normals
        for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
        {
            int index = f_it->idx();
            const std::vector<TriMesh::FaceHandle> face_neighbor = all_face_neighbor[index];
            TriMesh::Normal filtered_normal(0.0, 0.0, 0.0);
            for(int j = 0; j < (int)face_neighbor.size(); j++)
            {
                int current_face_index = face_neighbor[j].idx();

                double spatial_dis = (face_centroid[index] - face_centroid[current_face_index]).length();
                double spatial_weight = GaussianWeight(spatial_dis, sigma_s);
                double range_dis = (guided_normals[index] - guided_normals[current_face_index]).length();
                double range_weight = GaussianWeight(range_dis, sigma_r);

                filtered_normal += previous_normals[current_face_index] * (face_area[current_face_index] * spatial_weight * range_weight);
            }
            if(face_neighbor.size())
                filtered_normals[index] = filtered_normal.normalize();
        }

        // immediate update vertex position
        updateVertexPosition(mesh, filtered_normals, vertex_iteration_number, false);
    }
}